

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::while_statement::print(while_statement *this,wostream *os)

{
  wostream *pwVar1;
  syntax_node *psVar2;
  wostream *os_local;
  while_statement *this_local;
  
  pwVar1 = std::operator<<(os,"while_statement{");
  psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->cond_)->super_syntax_node;
  pwVar1 = mjs::operator<<(pwVar1,psVar2);
  pwVar1 = std::operator<<(pwVar1,", ");
  psVar2 = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                      (&this->s_)->super_syntax_node;
  pwVar1 = mjs::operator<<(pwVar1,psVar2);
  std::operator<<(pwVar1,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os  << "while_statement{" << *cond_ << ", " << *s_ << "}";
    }